

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],Type *params_5,char **params_6,
          StringPtr *params_7,char **params_8,StringPtr *params_9,char **params_10,String *params_11
          ,String *params_12)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  ArrayPtr<const_char> *params_12_00;
  size_t sVar4;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  StringPtr local_b8;
  ArrayPtr<const_char> local_a8;
  undefined1 local_98 [16];
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  long local_68;
  long local_60;
  CappedArray<char,_14UL> local_58;
  ArrayPtr<const_char> local_40;
  
  lVar1 = *(long *)(this + 8);
  local_68 = lVar1;
  if (lVar1 != 0) {
    local_68 = *(long *)this;
  }
  local_60 = lVar1 + -1;
  if (lVar1 == 0) {
    local_60 = 0;
  }
  pcVar2 = (params->content).ptr;
  local_78.size_ = strlen(pcVar2);
  local_78.ptr = pcVar2;
  local_88.size_ = strlen((char *)params_1);
  local_88.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(int *)params_2);
  local_98._8_8_ = strlen((char *)params_3);
  pcVar2 = operator*::TYPE_STRINGS[*(uint *)params_4];
  local_98._0_8_ = params_3;
  sVar4 = strlen(pcVar2);
  local_a8.size_ = sVar4 + 1;
  pcVar3 = *(char **)params_5;
  local_a8.ptr = pcVar2;
  local_b8.content.size_ = strlen(pcVar3);
  local_c8.ptr = *params_6;
  local_c8.size_ = (size_t)(params_6[1] + -1);
  pcVar2 = (params_7->content).ptr;
  local_b8.content.ptr = pcVar3;
  local_d8.size_ = strlen(pcVar2);
  local_e8.ptr = *params_8;
  local_e8.size_ = (size_t)(params_8[1] + -1);
  pcVar3 = (params_9->content).ptr;
  local_d8.ptr = pcVar2;
  local_f8.size_ = strlen(pcVar3);
  if (params_10[1] == (char *)0x0) {
    params_12_00 = (ArrayPtr<const_char> *)0x0;
  }
  else {
    params_12_00 = (ArrayPtr<const_char> *)*params_10;
  }
  pcVar2 = (char *)(params_11->content).size_;
  local_40.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_40.ptr = (params_11->content).ptr;
  }
  local_40.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_40.size_ = 0;
  }
  local_f8.ptr = pcVar3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_14UL> *)local_98,&local_a8,
             &local_b8,&local_c8,&local_d8,&local_e8,&local_f8,
             (ArrayPtr<const_char> *)&stack0xfffffffffffffef8,&local_40,params_12_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}